

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

void __thiscall llvm::DWARFVerifier::verifyDebugLineRows(DWARFVerifier *this)

{
  ushort uVar1;
  uint uVar2;
  DWARFContext *this_00;
  pointer pRVar3;
  StringRef Key;
  StringRef Key_00;
  bool bVar4;
  int iVar5;
  LineTable *pLVar6;
  raw_ostream *prVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  undefined **__n;
  void *__buf;
  void *__buf_00;
  char *pcVar11;
  undefined8 in_R8;
  unsigned_long uVar12;
  DWARFUnit *this_01;
  pointer pFVar13;
  Row *Row;
  pointer this_02;
  undefined8 *puVar14;
  StringRef CompDir;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef Str_06;
  StringRef Str_07;
  StringRef Str_08;
  StringRef Str_09;
  StringRef Str_10;
  StringRef Str_11;
  StringRef Str_12;
  StringRef Str_13;
  StringRef Str_14;
  StringRef Str_15;
  StringRef Str_16;
  OptionalStorage<unsigned_long,_true> OVar15;
  pair<llvm::StringMapIterator<unsigned_short>,_bool> pVar16;
  format_object_base local_128;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_118;
  Optional<llvm::DWARFFormValue> local_110;
  pointer local_d8;
  ulong local_d0;
  StringMapEntryBase **local_c8;
  raw_ostream *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined1 auStack_a8 [8];
  StringMap<unsigned_short,_llvm::MallocAllocator> FullPathMap;
  undefined1 local_80 [8];
  DWARFDie Die;
  undefined **local_68;
  undefined1 local_50 [8];
  string FullPath;
  
  this_00 = this->DCtx;
  DWARFContext::parseNormalUnits(this_00);
  uVar2 = (this_00->NormalUnits).NumInfoUnits;
  if (uVar2 == 0xffffffff) {
    uVar2 = (this_00->NormalUnits).
            super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
            .
            super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
            .
            super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
            .
            super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
            .super_SmallVectorBase.Size;
  }
  if (uVar2 != 0) {
    puVar14 = (undefined8 *)
              (this_00->NormalUnits).
              super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
              .
              super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
              .
              super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
              .
              super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
              .super_SmallVectorBase.BeginX;
    local_b0 = puVar14 + uVar2;
    local_68 = &PTR_home_01097f70;
    do {
      this_01 = (DWARFUnit *)*puVar14;
      DWARFUnit::extractDIEsIfNeeded(this_01,true);
      Die.U = (DWARFUnit *)
              (this_01->DieArray).
              super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
      if (Die.U == (DWARFUnit *)
                   (this_01->DieArray).
                   super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
        this_01 = (DWARFUnit *)0x0;
        Die.U = (DWARFUnit *)0x0;
      }
      local_80 = (undefined1  [8])this_01;
      pLVar6 = DWARFContext::getLineTableForUnit(this->DCtx,(DWARFUnit *)*puVar14);
      if (pLVar6 != (LineTable *)0x0) {
        Die.Die = (DWARFDebugInfoEntry *)&pLVar6->Prologue;
        auStack_a8 = (undefined1  [8])0x0;
        FullPathMap.super_StringMapImpl.TheTable = (StringMapEntryBase **)0x0;
        FullPathMap.super_StringMapImpl.NumBuckets = 0;
        FullPathMap.super_StringMapImpl.NumItems = 0x10;
        pFVar13 = (pLVar6->Prologue).FileNames.
                  super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_d8 = (pLVar6->Prologue).FileNames.
                   super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (pFVar13 != local_d8) {
          local_d0 = (ulong)(uint)((int)((ulong)((long)(pLVar6->Prologue).IncludeDirectories.
                                                                                                              
                                                  super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(pLVar6->Prologue).IncludeDirectories.
                                                                                                            
                                                  super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                  -0x55555555);
          uVar12 = 1;
          do {
            if (local_d0 < pFVar13->DirIdx) {
              this->NumDebugLineErrors = this->NumDebugLineErrors + 1;
              prVar7 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe85cd6,
                                        (StringRef)ZEXT816(0),SUB81(in_R8,0));
              Str.Length = 0xc;
              Str.Data = ".debug_line[";
              prVar7 = raw_ostream::operator<<(prVar7,Str);
              DWARFDie::find(&local_110,(DWARFDie *)local_80,DW_AT_stmt_list);
              if (local_110.Storage.hasVal == true) {
                OVar15 = (OptionalStorage<unsigned_long,_true>)
                         DWARFFormValue::getAsSectionOffset((DWARFFormValue *)&local_110);
              }
              else {
                OVar15 = (OptionalStorage<unsigned_long,_true>)ZEXT816(0);
              }
              if (((undefined1  [16])OVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
              goto LAB_00d987a6;
              FullPath._M_dataplus._M_p = "0x%08lx";
              local_50 = (undefined1  [8])&PTR_home_01097f70;
              FullPath._M_string_length = OVar15.field_0.value;
              prVar7 = raw_ostream::operator<<(prVar7,(format_object_base *)local_50);
              Str_00.Length = 0x16;
              Str_00.Data = "].prologue.file_names[";
              prVar7 = raw_ostream::operator<<(prVar7,Str_00);
              prVar7 = raw_ostream::operator<<(prVar7,uVar12);
              Str_01.Length = 0x25;
              Str_01.Data = "].dir_idx contains an invalid index: ";
              prVar7 = raw_ostream::operator<<(prVar7,Str_01);
              prVar7 = raw_ostream::operator<<(prVar7,pFVar13->DirIdx);
              Str_02.Length = 1;
              Str_02.Data = "\n";
              raw_ostream::operator<<(prVar7,Str_02);
            }
            local_50 = (undefined1  [8])&FullPath._M_string_length;
            FullPath._M_dataplus._M_p = (pointer)0x0;
            FullPath._M_string_length = FullPath._M_string_length & 0xffffffffffffff00;
            pcVar8 = DWARFUnit::getCompilationDir((DWARFUnit *)*puVar14);
            if (pcVar8 == (char *)0x0) {
              sVar9 = 0;
            }
            else {
              sVar9 = strlen(pcVar8);
            }
            in_R8 = 2;
            CompDir.Length = sVar9;
            CompDir.Data = pcVar8;
            bVar4 = DWARFDebugLine::Prologue::getFileNameByIndex
                              ((Prologue *)Die.Die,uVar12,CompDir,AbsoluteFilePath,
                               (string *)local_50,native);
            if (!bVar4) {
              __assert_fail("HasFullPath && \"Invalid index?\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                            ,0x2da,"void llvm::DWARFVerifier::verifyDebugLineRows()");
            }
            Key.Length = (size_t)FullPath._M_dataplus._M_p;
            Key.Data = (char *)local_50;
            iVar5 = StringMapImpl::FindKey((StringMapImpl *)auStack_a8,Key);
            uVar10 = (long)iVar5;
            if (iVar5 == -1) {
              uVar10 = (ulong)FullPathMap.super_StringMapImpl.TheTable & 0xffffffff;
            }
            if (uVar10 == ((ulong)FullPathMap.super_StringMapImpl.TheTable & 0xffffffff)) {
              Key_00.Length = (size_t)FullPath._M_dataplus._M_p;
              Key_00.Data = (char *)local_50;
              pVar16 = StringMap<unsigned_short,_llvm::MallocAllocator>::try_emplace<>
                                 ((StringMap<unsigned_short,_llvm::MallocAllocator> *)auStack_a8,
                                  Key_00);
              *(short *)(*(long *)pVar16.first.
                                  super_StringMapIterBase<llvm::StringMapIterator<unsigned_short>,_llvm::StringMapEntry<unsigned_short>_>
                                  .Ptr.
                                  super_StringMapIterBase<llvm::StringMapIterator<unsigned_short>,_llvm::StringMapEntry<unsigned_short>_>
                        + 8) = (short)uVar12;
            }
            else {
              local_c8 = (StringMapEntryBase **)auStack_a8;
              if ((uint)uVar12 !=
                  (uint)(ushort)(*(StringMapEntryBase **)((long)auStack_a8 + uVar10 * 8))[1].StrLen)
              {
                prVar7 = WithColor::warning((WithColor *)this->OS,(raw_ostream *)0xe85cd6,
                                            (StringRef)ZEXT816(0),SUB81(in_R8,0));
                Str_03.Length = 0xc;
                Str_03.Data = ".debug_line[";
                local_c0 = raw_ostream::operator<<(prVar7,Str_03);
                DWARFDie::find(&local_110,(DWARFDie *)local_80,DW_AT_stmt_list);
                if (local_110.Storage.hasVal == true) {
                  OVar15 = (OptionalStorage<unsigned_long,_true>)
                           DWARFFormValue::getAsSectionOffset((DWARFFormValue *)&local_110);
                }
                else {
                  OVar15 = (OptionalStorage<unsigned_long,_true>)ZEXT816(0);
                }
                if (((undefined1  [16])OVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                goto LAB_00d987a6;
                local_128.Fmt = "0x%08lx";
                local_128._vptr_format_object_base = (_func_int **)&PTR_home_01097f70;
                local_118.value = OVar15.field_0.value;
                prVar7 = raw_ostream::operator<<(local_c0,&local_128);
                Str_04.Length = 0x16;
                Str_04.Data = "].prologue.file_names[";
                prVar7 = raw_ostream::operator<<(prVar7,Str_04);
                prVar7 = raw_ostream::operator<<(prVar7,uVar12);
                Str_05.Length = 0x1f;
                Str_05.Data = "] is a duplicate of file_names[";
                prVar7 = raw_ostream::operator<<(prVar7,Str_05);
                prVar7 = raw_ostream::operator<<(prVar7,(ulong)(ushort)local_c8[uVar10][1].StrLen);
                Str_06.Length = 2;
                Str_06.Data = "]\n";
                raw_ostream::operator<<(prVar7,Str_06);
              }
            }
            if (local_50 != (undefined1  [8])&FullPath._M_string_length) {
              operator_delete((void *)local_50,FullPath._M_string_length + 1);
            }
            pFVar13 = pFVar13 + 1;
            uVar12 = (unsigned_long)((uint)uVar12 + 1);
          } while (pFVar13 != local_d8);
        }
        this_02 = (pLVar6->Rows).
                  super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pRVar3 = (pLVar6->Rows).
                 super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_b8 = puVar14;
        if (this_02 != pRVar3) {
          uVar12 = 0;
          uVar10 = 0;
          do {
            iVar5 = (int)uVar12;
            if ((this_02->Address).Address < uVar10) {
              this->NumDebugLineErrors = this->NumDebugLineErrors + 1;
              prVar7 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe85cd6,
                                        (StringRef)ZEXT816(0),SUB81(in_R8,0));
              Str_07.Length = 0xc;
              Str_07.Data = ".debug_line[";
              prVar7 = raw_ostream::operator<<(prVar7,Str_07);
              DWARFDie::find(&local_110,(DWARFDie *)local_80,DW_AT_stmt_list);
              if (local_110.Storage.hasVal == true) {
                OVar15 = (OptionalStorage<unsigned_long,_true>)
                         DWARFFormValue::getAsSectionOffset((DWARFFormValue *)&local_110);
              }
              else {
                OVar15 = (OptionalStorage<unsigned_long,_true>)ZEXT816(0);
              }
              if (((undefined1  [16])OVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
              goto LAB_00d987a6;
              FullPath._M_dataplus._M_p = "0x%08lx";
              local_50 = (undefined1  [8])&PTR_home_01097f70;
              __n = local_68;
              FullPath._M_string_length = OVar15.field_0.value;
              prVar7 = raw_ostream::operator<<(prVar7,(format_object_base *)local_50);
              Str_08.Length = 6;
              Str_08.Data = "] row[";
              prVar7 = raw_ostream::operator<<(prVar7,Str_08);
              prVar7 = raw_ostream::operator<<(prVar7,uVar12);
              Str_09.Length = 0x2a;
              Str_09.Data = "] decreases in address from previous row:\n";
              raw_ostream::operator<<(prVar7,Str_09);
              DWARFDebugLine::Row::dumpTableHeader(this->OS);
              if (iVar5 != 0) {
                DWARFDebugLine::Row::dump
                          ((pLVar6->Rows).
                           super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                           ._M_impl.super__Vector_impl_data._M_start + (iVar5 - 1),this->OS);
              }
              DWARFDebugLine::Row::dump(this_02,this->OS);
              prVar7 = this->OS;
              pcVar8 = prVar7->OutBufCur;
              if (pcVar8 < prVar7->OutBufEnd) {
                prVar7->OutBufCur = pcVar8 + 1;
                *pcVar8 = '\n';
              }
              else {
                raw_ostream::write(prVar7,10,__buf,(size_t)__n);
              }
            }
            bVar4 = DWARFDebugLine::Prologue::hasFileAtIndex
                              ((Prologue *)Die.Die,(ulong)this_02->File);
            if (!bVar4) {
              this->NumDebugLineErrors = this->NumDebugLineErrors + 1;
              uVar1 = (pLVar6->Prologue).FormParams.Version;
              prVar7 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe85cd6,
                                        (StringRef)ZEXT816(0),SUB81(in_R8,0));
              Str_10.Length = 0xc;
              Str_10.Data = ".debug_line[";
              prVar7 = raw_ostream::operator<<(prVar7,Str_10);
              DWARFDie::find(&local_110,(DWARFDie *)local_80,DW_AT_stmt_list);
              if (local_110.Storage.hasVal == true) {
                OVar15 = (OptionalStorage<unsigned_long,_true>)
                         DWARFFormValue::getAsSectionOffset((DWARFFormValue *)&local_110);
              }
              else {
                OVar15 = (OptionalStorage<unsigned_long,_true>)ZEXT816(0);
              }
              if (((undefined1  [16])OVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_00d987a6:
                __assert_fail("hasVal",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                              ,0xad,
                              "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]"
                             );
              }
              FullPath._M_dataplus._M_p = "0x%08lx";
              local_50 = (undefined1  [8])&PTR_home_01097f70;
              FullPath._M_string_length = OVar15.field_0.value;
              prVar7 = raw_ostream::operator<<(prVar7,(format_object_base *)local_50);
              Str_11.Length = 2;
              Str_11.Data = "][";
              prVar7 = raw_ostream::operator<<(prVar7,Str_11);
              prVar7 = raw_ostream::operator<<(prVar7,uVar12);
              Str_12.Length = 0x19;
              Str_12.Data = "] has invalid file index ";
              prVar7 = raw_ostream::operator<<(prVar7,Str_12);
              prVar7 = raw_ostream::operator<<(prVar7,(ulong)this_02->File);
              Str_13.Length = 0x14;
              Str_13.Data = " (valid values are [";
              prVar7 = raw_ostream::operator<<(prVar7,Str_13);
              pcVar8 = "1,";
              if (4 < uVar1) {
                pcVar8 = "0,";
              }
              Str_14.Length = 2;
              Str_14.Data = pcVar8;
              prVar7 = raw_ostream::operator<<(prVar7,Str_14);
              prVar7 = raw_ostream::operator<<
                                 (prVar7,((long)(pLVar6->Prologue).FileNames.
                                                super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pLVar6->Prologue).FileNames.
                                                super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                         -0xf0f0f0f0f0f0f0f);
              pcVar11 = "]";
              pcVar8 = ")";
              if (4 < uVar1) {
                pcVar11 = ")";
              }
              Str_15.Length = 1;
              Str_15.Data = pcVar11;
              prVar7 = raw_ostream::operator<<(prVar7,Str_15);
              Str_16.Length = 3;
              Str_16.Data = "):\n";
              raw_ostream::operator<<(prVar7,Str_16);
              DWARFDebugLine::Row::dumpTableHeader(this->OS);
              DWARFDebugLine::Row::dump(this_02,this->OS);
              prVar7 = this->OS;
              pcVar11 = prVar7->OutBufCur;
              if (pcVar11 < prVar7->OutBufEnd) {
                prVar7->OutBufCur = pcVar11 + 1;
                *pcVar11 = '\n';
              }
              else {
                raw_ostream::write(prVar7,10,__buf_00,(size_t)pcVar8);
              }
            }
            if ((this_02->field_0x1d & 4) == 0) {
              uVar10 = (this_02->Address).Address;
            }
            else {
              uVar10 = 0;
            }
            uVar12 = (unsigned_long)(iVar5 + 1);
            this_02 = this_02 + 1;
          } while (this_02 != pRVar3);
        }
        StringMap<unsigned_short,_llvm::MallocAllocator>::~StringMap
                  ((StringMap<unsigned_short,_llvm::MallocAllocator> *)auStack_a8);
        puVar14 = local_b8;
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != local_b0);
  }
  return;
}

Assistant:

void DWARFVerifier::verifyDebugLineRows() {
  for (const auto &CU : DCtx.compile_units()) {
    auto Die = CU->getUnitDIE();
    auto LineTable = DCtx.getLineTableForUnit(CU.get());
    // If there is no line table we will have created an error in the
    // .debug_info verifier or in verifyDebugLineStmtOffsets().
    if (!LineTable)
      continue;

    // Verify prologue.
    uint32_t MaxDirIndex = LineTable->Prologue.IncludeDirectories.size();
    uint32_t FileIndex = 1;
    StringMap<uint16_t> FullPathMap;
    for (const auto &FileName : LineTable->Prologue.FileNames) {
      // Verify directory index.
      if (FileName.DirIdx > MaxDirIndex) {
        ++NumDebugLineErrors;
        error() << ".debug_line["
                << format("0x%08" PRIx64,
                          *toSectionOffset(Die.find(DW_AT_stmt_list)))
                << "].prologue.file_names[" << FileIndex
                << "].dir_idx contains an invalid index: " << FileName.DirIdx
                << "\n";
      }

      // Check file paths for duplicates.
      std::string FullPath;
      const bool HasFullPath = LineTable->getFileNameByIndex(
          FileIndex, CU->getCompilationDir(),
          DILineInfoSpecifier::FileLineInfoKind::AbsoluteFilePath, FullPath);
      assert(HasFullPath && "Invalid index?");
      (void)HasFullPath;
      auto It = FullPathMap.find(FullPath);
      if (It == FullPathMap.end())
        FullPathMap[FullPath] = FileIndex;
      else if (It->second != FileIndex) {
        warn() << ".debug_line["
               << format("0x%08" PRIx64,
                         *toSectionOffset(Die.find(DW_AT_stmt_list)))
               << "].prologue.file_names[" << FileIndex
               << "] is a duplicate of file_names[" << It->second << "]\n";
      }

      FileIndex++;
    }

    // Verify rows.
    uint64_t PrevAddress = 0;
    uint32_t RowIndex = 0;
    for (const auto &Row : LineTable->Rows) {
      // Verify row address.
      if (Row.Address.Address < PrevAddress) {
        ++NumDebugLineErrors;
        error() << ".debug_line["
                << format("0x%08" PRIx64,
                          *toSectionOffset(Die.find(DW_AT_stmt_list)))
                << "] row[" << RowIndex
                << "] decreases in address from previous row:\n";

        DWARFDebugLine::Row::dumpTableHeader(OS);
        if (RowIndex > 0)
          LineTable->Rows[RowIndex - 1].dump(OS);
        Row.dump(OS);
        OS << '\n';
      }

      // Verify file index.
      if (!LineTable->hasFileAtIndex(Row.File)) {
        ++NumDebugLineErrors;
        bool isDWARF5 = LineTable->Prologue.getVersion() >= 5;
        error() << ".debug_line["
                << format("0x%08" PRIx64,
                          *toSectionOffset(Die.find(DW_AT_stmt_list)))
                << "][" << RowIndex << "] has invalid file index " << Row.File
                << " (valid values are [" << (isDWARF5 ? "0," : "1,")
                << LineTable->Prologue.FileNames.size()
                << (isDWARF5 ? ")" : "]") << "):\n";
        DWARFDebugLine::Row::dumpTableHeader(OS);
        Row.dump(OS);
        OS << '\n';
      }
      if (Row.EndSequence)
        PrevAddress = 0;
      else
        PrevAddress = Row.Address.Address;
      ++RowIndex;
    }
  }
}